

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

Error asmjit::v1_14::Formatter::formatNode
                (String *sb,FormatOptions *formatOptions,BaseBuilder *builder,BaseNode *node)

{
  BaseNode BVar1;
  CodeHolder *pCVar2;
  Error EVar3;
  Operand_ *op;
  FuncValuePack *pack;
  Section **ppSVar4;
  unsigned_short *puVar5;
  ulong uVar6;
  ushort uVar7;
  size_t sVar8;
  char *pcVar9;
  uint32_t i;
  uint32_t index;
  FormatFlags FVar10;
  FormatOptions *pFVar11;
  uint32_t argIndex;
  ulong uVar12;
  RegOnly *vRegs;
  ConstPoolNode *constPoolNode;
  FormatPaddingGroup local_34;
  
  pFVar11 = formatOptions;
  if ((*(int *)(node + 0x14) != 0) && ((formatOptions->_flags & kPositions) != kNone)) {
    pFVar11 = (FormatOptions *)0x1;
    EVar3 = String::_opFormat(sb,kAppend,"<%05u> ");
    if (EVar3 != 0) {
      return EVar3;
    }
  }
  uVar12 = (ulong)(byte)*sb;
  if (0x1e < uVar12) {
    uVar12 = *(ulong *)(sb + 8);
  }
  switch(node[0x10]) {
  case (BaseNode)0x1:
  case (BaseNode)0xf:
  case (BaseNode)0x12:
    EVar3 = (*(builder->super_BaseEmitter)._funcs.formatInstruction)
                      (sb,formatOptions->_flags,&builder->super_BaseEmitter,
                       (builder->super_BaseEmitter)._environment._arch,(BaseInst *)(node + 0x30),
                       (Operand_ *)(node + 0x40),SUB18(node[0x12],0));
    break;
  case (BaseNode)0x2:
    pCVar2 = (builder->super_BaseEmitter)._code;
    if (*(uint *)(node + 0x30) < *(uint *)&pCVar2->field_0xe0) {
      ppSVar4 = ZoneVector<asmjit::v1_14::Section_*>::operator[]
                          (&pCVar2->_sections,(ulong)*(uint *)(node + 0x30));
      EVar3 = String::_opFormat(sb,kAppend,".section %s",&(*ppSVar4)->_name);
      break;
    }
    goto LAB_0011903d;
  case (BaseNode)0x3:
    EVar3 = formatLabel(sb,(FormatFlags)pFVar11,&builder->super_BaseEmitter,
                        *(uint32_t *)(node + 0x30));
    if (EVar3 != 0) {
      return EVar3;
    }
    pcVar9 = ":";
    goto LAB_00118fd4;
  case (BaseNode)0x4:
    pcVar9 = "data";
    if (node[0x12] == (BaseNode)0x0) {
      pcVar9 = "code";
    }
    EVar3 = String::_opFormat(sb,kAppend,".align %u (%s)",(ulong)*(uint *)(node + 0x30),pcVar9);
    break;
  case (BaseNode)0x5:
    FVar10 = kMachineCode;
    EVar3 = String::_opChar(sb,kAppend,'.');
    if (EVar3 != 0) {
      return EVar3;
    }
    EVar3 = formatDataType(sb,FVar10,(builder->super_BaseEmitter)._environment._arch,
                           (TypeId)node[0x12]);
    if (EVar3 != 0) {
      return EVar3;
    }
    EVar3 = String::_opFormat(sb,kAppend," {Count=%zu Repeat=%zu TotalSize=%zu}",
                              *(long *)(node + 0x30),*(undefined8 *)(node + 0x38),
                              (ulong)(byte)node[0x13] * *(long *)(node + 0x30));
    break;
  case (BaseNode)0x6:
    FVar10 = kMachineCode;
    EVar3 = String::_opString(sb,kAppend,".label ",0xffffffffffffffff);
    if (EVar3 != 0) {
      return EVar3;
    }
    EVar3 = formatLabel(sb,FVar10,&builder->super_BaseEmitter,*(uint32_t *)(node + 0x30));
    break;
  case (BaseNode)0x7:
    FVar10 = kMachineCode;
    EVar3 = String::_opString(sb,kAppend,".label (",0xffffffffffffffff);
    if (EVar3 != 0) {
      return EVar3;
    }
    EVar3 = formatLabel(sb,FVar10,&builder->super_BaseEmitter,*(uint32_t *)(node + 0x30));
    if (EVar3 != 0) {
      return EVar3;
    }
    FVar10 = kMachineCode;
    EVar3 = String::_opString(sb,kAppend," - ",0xffffffffffffffff);
    if (EVar3 != 0) {
      return EVar3;
    }
    EVar3 = formatLabel(sb,FVar10,&builder->super_BaseEmitter,*(uint32_t *)(node + 0x34));
    if (EVar3 != 0) {
      return EVar3;
    }
    pcVar9 = ")";
    goto LAB_00118fd4;
  case (BaseNode)0x8:
    EVar3 = String::_opFormat(sb,kAppend,"[ConstPool Size=%zu Alignment=%zu]",
                              *(undefined8 *)(node + 0x128),*(undefined8 *)(node + 0x130));
    break;
  case (BaseNode)0x9:
    EVar3 = String::_opFormat(sb,kAppend,"; %s",*(undefined8 *)(node + 0x28));
    return EVar3;
  case (BaseNode)0xa:
    pcVar9 = "[Sentinel]";
    if (node[0x12] == (BaseNode)0x1) {
      pcVar9 = "[FuncEnd]";
    }
LAB_00118fd4:
    EVar3 = String::_opString(sb,kAppend,pcVar9,0xffffffffffffffff);
    break;
  default:
    EVar3 = String::_opFormat(sb,kAppend,"[UserNode:%u]",(ulong)(byte)node[0x10]);
    break;
  case (BaseNode)0x10:
    if ((builder->super_BaseEmitter)._emitterType == kCompiler) {
      EVar3 = formatLabel(sb,(FormatFlags)pFVar11,&builder->super_BaseEmitter,
                          *(uint32_t *)(node + 0x30));
      if (EVar3 != 0) {
        return EVar3;
      }
      EVar3 = String::_opString(sb,kAppend,": ",0xffffffffffffffff);
      if (EVar3 != 0) {
        return EVar3;
      }
      EVar3 = formatFuncValuePack(sb,formatOptions->_flags,(BaseCompiler *)builder,
                                  (FuncValuePack *)(node + 0xc0),(RegOnly *)0x0);
      if (EVar3 != 0) {
        return EVar3;
      }
      EVar3 = String::_opString(sb,kAppend," Func(",0xffffffffffffffff);
      if (EVar3 != 0) {
        return EVar3;
      }
      BVar1 = node[0xa8];
      if ((ulong)(byte)BVar1 == 0) {
        EVar3 = String::_opString(sb,kAppend,"void",0xffffffffffffffff);
        if (EVar3 != 0) {
          return EVar3;
        }
      }
      else {
        FVar10 = formatOptions->_flags;
        vRegs = *(RegOnly **)(node + 0x348);
        sVar8 = 0;
        while ((byte)BVar1 != sVar8) {
          if ((sVar8 != 0) &&
             (EVar3 = String::_opString(sb,kAppend,", ",0xffffffffffffffff), EVar3 != 0)) {
            return EVar3;
          }
          pack = FuncDetail::argPack((FuncDetail *)(node + 0x34),sVar8);
          EVar3 = formatFuncValuePack(sb,FVar10,(BaseCompiler *)builder,pack,vRegs);
          sVar8 = sVar8 + 1;
          vRegs = vRegs + 4;
          if (EVar3 != 0) {
            return EVar3;
          }
        }
      }
      EVar3 = String::_opString(sb,kAppend,")",0xffffffffffffffff);
      if (EVar3 != 0) {
        return EVar3;
      }
    }
    goto LAB_0011903d;
  case (BaseNode)0x11:
    EVar3 = String::_opString(sb,kAppend,"[FuncRet]",0xffffffffffffffff);
    if (EVar3 != 0) {
      return EVar3;
    }
    for (index = 0; index != 2; index = index + 1) {
      op = &InstNode::op((InstNode *)node,index)->super_Operand_;
      if ((op->_signature)._bits != 0) {
        pcVar9 = ", ";
        if (index == 0) {
          pcVar9 = " ";
        }
        EVar3 = String::_opString(sb,kAppend,pcVar9,0xffffffffffffffff);
        if (EVar3 != 0) {
          return EVar3;
        }
        EVar3 = formatOperand(sb,formatOptions->_flags,&builder->super_BaseEmitter,
                              (builder->super_BaseEmitter)._environment._arch,op);
        if (EVar3 != 0) {
          return EVar3;
        }
      }
    }
    goto LAB_0011903d;
  }
  if (EVar3 == 0) {
LAB_0011903d:
    if (*(long *)(node + 0x28) != 0) {
      local_34 = kRegularLine;
      puVar5 = Support::Array<unsigned_short,_2UL>::operator[]<asmjit::v1_14::FormatPaddingGroup>
                         (&formatOptions->_padding,&local_34);
      uVar7 = 0x2c;
      if (*puVar5 != 0) {
        uVar7 = *puVar5;
      }
      uVar6 = (ulong)(byte)*sb;
      if (0x1e < uVar6) {
        uVar6 = *(ulong *)(sb + 8);
      }
      sVar8 = (ulong)uVar7 - (uVar6 - uVar12);
      if ((uVar6 - uVar12 <= (ulong)uVar7 && sVar8 != 0) &&
         (EVar3 = String::_opChars(sb,kAppend,' ',sVar8), EVar3 != 0)) {
        return EVar3;
      }
      EVar3 = String::_opString(sb,kAppend,"; ",0xffffffffffffffff);
      if (EVar3 != 0) {
        return EVar3;
      }
      EVar3 = String::_opString(sb,kAppend,*(char **)(node + 0x28),0xffffffffffffffff);
      if (EVar3 != 0) {
        return EVar3;
      }
    }
    EVar3 = 0;
  }
  return EVar3;
}

Assistant:

Error formatNode(
  String& sb,
  const FormatOptions& formatOptions,
  const BaseBuilder* builder,
  const BaseNode* node) noexcept {

  if (node->hasPosition() && formatOptions.hasFlag(FormatFlags::kPositions))
    ASMJIT_PROPAGATE(sb.appendFormat("<%05u> ", node->position()));

  size_t startLineIndex = sb.size();

  switch (node->type()) {
    case NodeType::kInst:
    case NodeType::kJump: {
      const InstNode* instNode = node->as<InstNode>();
      ASMJIT_PROPAGATE(builder->_funcs.formatInstruction(sb, formatOptions.flags(), builder,
        builder->arch(),
        instNode->baseInst(), instNode->operands(), instNode->opCount()));
      break;
    }

    case NodeType::kSection: {
      const SectionNode* sectionNode = node->as<SectionNode>();
      if (builder->_code->isSectionValid(sectionNode->id())) {
        const Section* section = builder->_code->sectionById(sectionNode->id());
        ASMJIT_PROPAGATE(sb.appendFormat(".section %s", section->name()));
      }
      break;
    }

    case NodeType::kLabel: {
      const LabelNode* labelNode = node->as<LabelNode>();
      ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, labelNode->labelId()));
      ASMJIT_PROPAGATE(sb.append(":"));
      break;
    }

    case NodeType::kAlign: {
      const AlignNode* alignNode = node->as<AlignNode>();
      ASMJIT_PROPAGATE(sb.appendFormat(".align %u (%s)",
        alignNode->alignment(),
        alignNode->alignMode() == AlignMode::kCode ? "code" : "data"));
      break;
    }

    case NodeType::kEmbedData: {
      const EmbedDataNode* embedNode = node->as<EmbedDataNode>();
      ASMJIT_PROPAGATE(sb.append('.'));
      ASMJIT_PROPAGATE(formatDataType(sb, formatOptions.flags(), builder->arch(), embedNode->typeId()));
      ASMJIT_PROPAGATE(sb.appendFormat(" {Count=%zu Repeat=%zu TotalSize=%zu}", embedNode->itemCount(), embedNode->repeatCount(), embedNode->dataSize()));
      break;
    }

    case NodeType::kEmbedLabel: {
      const EmbedLabelNode* embedNode = node->as<EmbedLabelNode>();
      ASMJIT_PROPAGATE(sb.append(".label "));
      ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, embedNode->labelId()));
      break;
    }

    case NodeType::kEmbedLabelDelta: {
      const EmbedLabelDeltaNode* embedNode = node->as<EmbedLabelDeltaNode>();
      ASMJIT_PROPAGATE(sb.append(".label ("));
      ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, embedNode->labelId()));
      ASMJIT_PROPAGATE(sb.append(" - "));
      ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, embedNode->baseLabelId()));
      ASMJIT_PROPAGATE(sb.append(")"));
      break;
    }

    case NodeType::kConstPool: {
      const ConstPoolNode* constPoolNode = node->as<ConstPoolNode>();
      ASMJIT_PROPAGATE(sb.appendFormat("[ConstPool Size=%zu Alignment=%zu]", constPoolNode->size(), constPoolNode->alignment()));
      break;
    };

    case NodeType::kComment: {
      const CommentNode* commentNode = node->as<CommentNode>();
      return sb.appendFormat("; %s", commentNode->inlineComment());
    }

    case NodeType::kSentinel: {
      const SentinelNode* sentinelNode = node->as<SentinelNode>();
      const char* sentinelName = nullptr;

      switch (sentinelNode->sentinelType()) {
        case SentinelType::kFuncEnd:
          sentinelName = "[FuncEnd]";
          break;

        default:
          sentinelName = "[Sentinel]";
          break;
      }

      ASMJIT_PROPAGATE(sb.append(sentinelName));
      break;
    }

#ifndef ASMJIT_NO_COMPILER
    case NodeType::kFunc: {
      const FuncNode* funcNode = node->as<FuncNode>();

      if (builder->isCompiler()) {
        ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, funcNode->labelId()));
        ASMJIT_PROPAGATE(sb.append(": "));

        ASMJIT_PROPAGATE(formatFuncRets(sb, formatOptions.flags(), static_cast<const BaseCompiler*>(builder), funcNode->detail()));
        ASMJIT_PROPAGATE(sb.append(" Func("));
        ASMJIT_PROPAGATE(formatFuncArgs(sb, formatOptions.flags(), static_cast<const BaseCompiler*>(builder), funcNode->detail(), funcNode->argPacks()));
        ASMJIT_PROPAGATE(sb.append(")"));
      }
      break;
    }

    case NodeType::kFuncRet: {
      const FuncRetNode* retNode = node->as<FuncRetNode>();
      ASMJIT_PROPAGATE(sb.append("[FuncRet]"));

      for (uint32_t i = 0; i < 2; i++) {
        const Operand_& op = retNode->op(i);
        if (!op.isNone()) {
          ASMJIT_PROPAGATE(sb.append(i == 0 ? " " : ", "));
          ASMJIT_PROPAGATE(formatOperand(sb, formatOptions.flags(), builder, builder->arch(), op));
        }
      }
      break;
    }

    case NodeType::kInvoke: {
      const InvokeNode* invokeNode = node->as<InvokeNode>();
      ASMJIT_PROPAGATE(builder->_funcs.formatInstruction(sb, formatOptions.flags(), builder,
        builder->arch(),
        invokeNode->baseInst(), invokeNode->operands(), invokeNode->opCount()));
      break;
    }
#endif

    default: {
      ASMJIT_PROPAGATE(sb.appendFormat("[UserNode:%u]", node->type()));
      break;
    }
  }

  if (node->hasInlineComment()) {
    size_t requiredPadding = paddingFromOptions(formatOptions, FormatPaddingGroup::kRegularLine);
    size_t currentPadding = sb.size() - startLineIndex;

    if (currentPadding < requiredPadding)
      ASMJIT_PROPAGATE(sb.appendChars(' ', requiredPadding - currentPadding));

    ASMJIT_PROPAGATE(sb.append("; "));
    ASMJIT_PROPAGATE(sb.append(node->inlineComment()));
  }

  return kErrorOk;
}